

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_colour.c
# Opt level: O0

int main(void)

{
  HRESULT HVar1;
  DecklinkDisplayMode displayMode;
  ulong uVar2;
  int local_8c;
  DecklinkDisplayMode mode2;
  int o;
  uint8_t *bytes;
  cdecklink_video_frame_t *frame;
  cdecklink_mutable_video_frame_t *mutable_frame;
  long height;
  long width;
  char *name;
  cdecklink_display_mode_t_conflict *pcStack_50;
  int mode_i;
  cdecklink_display_mode_t *mode;
  cdecklink_display_mode_iterator_t *mode_iterator;
  cdecklink_output_t *output;
  char *display_name;
  cdecklink_device_t_conflict *pcStack_28;
  int i;
  cdecklink_device_t *device;
  cdecklink_iterator_t_conflict *pcStack_18;
  int index;
  cdecklink_iterator_t *iterator;
  
  iterator._4_4_ = 0;
  pcStack_18 = cdecklink_create_decklink_iterator_instance();
  if (pcStack_18 != (cdecklink_iterator_t_conflict *)0x0) {
    device._4_4_ = 3;
    printf("Choose decklink device to output to: ");
    printf("\n");
    __isoc99_scanf("%d",(long)&device + 4);
    display_name._4_4_ = 0xffffffff;
    while( true ) {
      pcStack_28 = (cdecklink_device_t_conflict *)0x0;
      HVar1 = cdecklink_iterator_next(pcStack_18,&stack0xffffffffffffffd8);
      if ((HVar1 != 0) ||
         (display_name._4_4_ = display_name._4_4_ + 1, display_name._4_4_ == device._4_4_)) break;
      cdecklink_device_release(pcStack_28);
    }
    if ((display_name._4_4_ == device._4_4_) && (pcStack_28 != (cdecklink_device_t_conflict *)0x0))
    {
      HVar1 = cdecklink_device_get_display_name(pcStack_28,(char **)&output);
      if (HVar1 < 0) {
        printf("Failed to get device name\n");
      }
      else {
        printf("Selected device: %s\n",output);
        cdecklink_free_string((char *)output);
        HVar1 = cdecklink_device_query_output
                          (pcStack_28,(cdecklink_output_t_conflict **)&mode_iterator);
        if (HVar1 < 0) {
          printf("Device does not support output\n");
        }
        else {
          HVar1 = cdecklink_output_get_display_mode_iterator
                            ((cdecklink_output_t_conflict *)mode_iterator,
                             (cdecklink_display_mode_iterator_t_conflict **)&mode);
          if (HVar1 == 0) {
            printf("Select videomode:\n");
            name._4_4_ = 0;
            while (HVar1 = cdecklink_display_mode_iterator_next
                                     ((cdecklink_display_mode_iterator_t_conflict *)mode,
                                      &stack0xffffffffffffffb0), HVar1 == 0) {
              HVar1 = cdecklink_display_mode_get_name(pcStack_50,(char **)&width);
              if (-1 < HVar1) {
                uVar2 = (ulong)name._4_4_;
                name._4_4_ = name._4_4_ + 1;
                printf("%d: %s\n",uVar2,width);
                cdecklink_free_string((char *)width);
                cdecklink_display_mode_release(pcStack_50);
                pcStack_50 = (cdecklink_display_mode_t_conflict *)0x0;
              }
            }
            cdecklink_display_mode_iterator_release
                      ((cdecklink_display_mode_iterator_t_conflict *)mode);
            mode = (cdecklink_display_mode_t *)0x0;
            device._4_4_ = 7;
            printf("\n");
            __isoc99_scanf("%d",(long)&device + 4);
            HVar1 = cdecklink_output_get_display_mode_iterator
                              ((cdecklink_output_t_conflict *)mode_iterator,
                               (cdecklink_display_mode_iterator_t_conflict **)&mode);
            if (HVar1 == 0) {
              name._4_4_ = 0xffffffff;
              while ((HVar1 = cdecklink_display_mode_iterator_next
                                        ((cdecklink_display_mode_iterator_t_conflict *)mode,
                                         &stack0xffffffffffffffb0), HVar1 == 0 &&
                     (name._4_4_ = name._4_4_ + 1, name._4_4_ != device._4_4_))) {
                cdecklink_display_mode_release(pcStack_50);
                pcStack_50 = (cdecklink_display_mode_t_conflict *)0x0;
              }
              height = cdecklink_display_mode_get_width(pcStack_50);
              mutable_frame =
                   (cdecklink_mutable_video_frame_t *)cdecklink_display_mode_get_height(pcStack_50);
              HVar1 = cdecklink_output_create_video_frame
                                ((cdecklink_output_t_conflict *)mode_iterator,(int32_t)height,
                                 (int32_t)mutable_frame,(int32_t)(height << 2),0x42475241,0,
                                 (cdecklink_mutable_video_frame_t_conflict **)&frame);
              if (HVar1 == 0) {
                bytes = (uint8_t *)
                        cdecklink_video_input_frame_to_video_frame
                                  ((cdecklink_video_input_frame_t *)frame);
                HVar1 = cdecklink_video_frame_get_bytes
                                  ((cdecklink_video_frame_t_conflict *)bytes,(void **)&mode2);
                if (HVar1 == 0) {
                  for (local_8c = 0; (long)local_8c < height * (long)mutable_frame * 4;
                      local_8c = local_8c + 4) {
                    *(undefined1 *)((long)_mode2 + (long)local_8c) = 0xff;
                    *(undefined1 *)((long)_mode2 + (long)(local_8c + 1)) = 0x78;
                    *(undefined1 *)((long)_mode2 + (long)(local_8c + 2)) = 0;
                    *(undefined1 *)((long)_mode2 + (long)(local_8c + 3)) = 0xff;
                  }
                  displayMode = cdecklink_display_mode_get_display_mode(pcStack_50);
                  HVar1 = cdecklink_output_enable_video_output
                                    ((cdecklink_output_t_conflict *)mode_iterator,displayMode,0);
                  if (HVar1 == 0) {
                    HVar1 = cdecklink_output_display_video_frame_sync
                                      ((cdecklink_output_t_conflict *)mode_iterator,
                                       (cdecklink_video_frame_t_conflict *)bytes);
                    if (HVar1 == 0) {
                      sleep(1);
                      printf("Press Any Key to Continue\n");
                      __isoc99_scanf("%d",(long)&device + 4);
                    }
                    else {
                      printf("Failed to schedule frame\n");
                    }
                  }
                  else {
                    printf("Failed to enable video output\n");
                  }
                }
                else {
                  printf("Failed to get frame bytes\n");
                }
              }
              else {
                printf("Failed to create output frame\n");
              }
            }
            else {
              printf("Failed to create output mode iterator\n");
            }
          }
          else {
            printf("Failed to create output mode iterator\n");
          }
        }
      }
    }
    else {
      printf("Invalid device index\n");
    }
  }
  if (frame != (cdecklink_video_frame_t *)0x0) {
    cdecklink_mutable_video_frame_release((cdecklink_mutable_video_frame_t_conflict *)frame);
  }
  if (mode != (cdecklink_display_mode_t *)0x0) {
    cdecklink_display_mode_iterator_release((cdecklink_display_mode_iterator_t_conflict *)mode);
  }
  if (mode_iterator != (cdecklink_display_mode_iterator_t *)0x0) {
    cdecklink_output_release((cdecklink_output_t_conflict *)mode_iterator);
  }
  if (pcStack_28 != (cdecklink_device_t_conflict *)0x0) {
    cdecklink_device_release(pcStack_28);
  }
  if (pcStack_18 != (cdecklink_iterator_t_conflict *)0x0) {
    cdecklink_iterator_release(pcStack_18);
  }
  return 0;
}

Assistant:

int main() {
    cdecklink_iterator_t *iterator = cdecklink_create_decklink_iterator_instance();
    if (!iterator)
        goto CLEANUP;

    int index = 3;
    printf("Choose decklink device to output to: ");
    printf("\n");
    scanf("%d", &index);

    // Fetch the selected device
    cdecklink_device_t *device = NULL;
    int i = -1;
    while (cdecklink_iterator_next(iterator, &device) == S_OK) {
        if (++i == index) {
            break;
        }

        cdecklink_device_release(device);
        device = NULL;
    }

    if (i != index || device == NULL) {
        printf("Invalid device index\n");
        goto CLEANUP;
    }

    const char *display_name;
    if (FAILED(cdecklink_device_get_display_name(device, &display_name))) {
        printf("Failed to get device name\n");
        goto CLEANUP;
    }
    printf("Selected device: %s\n", display_name);
    cdecklink_free_string(display_name);

    cdecklink_output_t *output;
    if (FAILED(cdecklink_device_query_output(device, &output))) {
        printf("Device does not support output\n");
        goto CLEANUP;
    }

    // List the supported modes
    cdecklink_display_mode_iterator_t *mode_iterator;
    if (cdecklink_output_get_display_mode_iterator(output, &mode_iterator) != S_OK) {
        printf("Failed to create output mode iterator\n");
        goto CLEANUP;
    }

    printf("Select videomode:\n");
    cdecklink_display_mode_t *mode;
    int mode_i = 0;
    while (cdecklink_display_mode_iterator_next(mode_iterator, &mode) == S_OK) {
        const char *name;
        if (FAILED(cdecklink_display_mode_get_name(mode, &name))) {
            // TODO
        } else {
            printf("%d: %s\n", mode_i++, name);
            cdecklink_free_string(name);
            cdecklink_display_mode_release(mode);
            mode = NULL;
        }
    }
    cdecklink_display_mode_iterator_release(mode_iterator);
    mode_iterator = NULL;

    index = 7;
    printf("\n");
    scanf("%d", &index);

    // Fetch the selected mode
    if (cdecklink_output_get_display_mode_iterator(output, &mode_iterator) != S_OK) {
        printf("Failed to create output mode iterator\n");
        goto CLEANUP;
    }
    mode_i = -1;
    while (cdecklink_display_mode_iterator_next(mode_iterator, &mode) == S_OK) {
        if (++mode_i == index) {
            break;
        }
        cdecklink_display_mode_release(mode);
        mode = NULL;
    }

    // Create a frame
    long width = cdecklink_display_mode_get_width(mode);
    long height = cdecklink_display_mode_get_height(mode);
    cdecklink_mutable_video_frame_t *mutable_frame;
    if (cdecklink_output_create_video_frame(output, width, height, width * 4, decklinkFormat8BitBGRA,
                                                   decklinkFrameFlagDefault, &mutable_frame) != S_OK) {
        printf("Failed to create output frame\n");
        goto CLEANUP;
    }
    cdecklink_video_frame_t *frame = cdecklink_video_input_frame_to_video_frame(mutable_frame);

    // Fill the frame
    uint8_t *bytes;
    if (cdecklink_video_frame_get_bytes(frame, (void **) (&bytes)) != S_OK) {
        printf("Failed to get frame bytes\n");
        goto CLEANUP;
    }
    for (int o = 0; o < width * height * 4; o += 4) {
        bytes[o] = 255;
        bytes[o + 1] = 120;
        bytes[o + 2] = 0;
        bytes[o + 3] = 255;
    }

    DecklinkDisplayMode mode2 = cdecklink_display_mode_get_display_mode(mode);
    if (cdecklink_output_enable_video_output(output, mode2, decklinkVideoOutputFlagDefault) != S_OK) {
        printf("Failed to enable video output\n");
        goto CLEANUP;
    }

    // Schedule frame
    if (cdecklink_output_display_video_frame_sync(output, frame) != S_OK) {
        printf("Failed to schedule frame\n");
        goto CLEANUP;
    }

    // Wait for termination
    sleep(1);
    printf("Press Any Key to Continue\n");
    scanf("%d", &index);

    CLEANUP:

    if (mutable_frame)
        cdecklink_mutable_video_frame_release(mutable_frame);

    if (mode_iterator)
        cdecklink_display_mode_iterator_release(mode_iterator);

    if (output)
        cdecklink_output_release(output);

    if (device)
        cdecklink_device_release(device);

    if (iterator)
        cdecklink_iterator_release(iterator);

    return 0;
}